

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

ModuleScope * __thiscall
capnp::compiler::Compiler::add(ModuleScope *__return_storage_ptr__,Compiler *this,Module *module)

{
  uint64_t uVar1;
  CompiledModule *pCVar2;
  Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> local_30;
  
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)&local_30,
             &this->impl);
  pCVar2 = Impl::addInternal((local_30.ptr)->ptr,module);
  kj::Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::~Locked(&local_30);
  uVar1 = (pCVar2->rootNode).id;
  __return_storage_ptr__->compiler = this;
  __return_storage_ptr__->id = uVar1;
  __return_storage_ptr__->node = &pCVar2->rootNode;
  return __return_storage_ptr__;
}

Assistant:

Compiler::ModuleScope Compiler::add(Module& module) const {
  Node& root = impl.lockExclusive()->get()->addInternal(module).getRootNode();
  return ModuleScope(*this, root.getId(), root);
}